

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  ulong uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  AABBNodeMB4D *node1;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong unaff_RBX;
  size_t mask;
  NodeRef *pNVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  size_t sVar45;
  uint uVar46;
  undefined4 uVar47;
  ulong uVar48;
  bool bVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar100;
  float fVar101;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 *local_1568;
  ulong local_1560;
  ulong local_1558;
  NodeRef *local_1550;
  ulong local_1548;
  ulong local_1540;
  RTCFilterFunctionNArguments args;
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  RTCHitN local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  uint local_1338;
  uint uStack_1334;
  uint uStack_1330;
  uint uStack_132c;
  uint uStack_1328;
  uint uStack_1324;
  uint uStack_1320;
  uint uStack_131c;
  undefined1 local_1318 [32];
  int local_12f8;
  int iStack_12f4;
  int iStack_12f0;
  int iStack_12ec;
  int iStack_12e8;
  int iStack_12e4;
  int iStack_12e0;
  int iStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined4 local_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined4 uStack_1200;
  undefined4 uStack_11fc;
  undefined4 local_11f8;
  undefined4 uStack_11f4;
  undefined4 uStack_11f0;
  undefined4 uStack_11ec;
  undefined4 uStack_11e8;
  undefined4 uStack_11e4;
  undefined4 uStack_11e0;
  undefined4 uStack_11dc;
  NodeRef stack [564];
  
  stack[0] = root;
  uVar47 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar92._4_4_ = uVar47;
  auVar92._0_4_ = uVar47;
  auVar92._8_4_ = uVar47;
  auVar92._12_4_ = uVar47;
  auVar92._16_4_ = uVar47;
  auVar92._20_4_ = uVar47;
  auVar92._24_4_ = uVar47;
  auVar92._28_4_ = uVar47;
  local_11f8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  uStack_11f4 = local_11f8;
  uStack_11f0 = local_11f8;
  uStack_11ec = local_11f8;
  uStack_11e8 = local_11f8;
  uStack_11e4 = local_11f8;
  uStack_11e0 = local_11f8;
  uStack_11dc = local_11f8;
  local_1218 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uStack_1214 = local_1218;
  uStack_1210 = local_1218;
  uStack_120c = local_1218;
  uStack_1208 = local_1218;
  uStack_1204 = local_1218;
  uStack_1200 = local_1218;
  uStack_11fc = local_1218;
  local_1298 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_12b8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_12d8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1238 = local_1298 * 0.99999964;
  fStack_1234 = local_1238;
  fStack_1230 = local_1238;
  fStack_122c = local_1238;
  fStack_1228 = local_1238;
  fStack_1224 = local_1238;
  fStack_1220 = local_1238;
  fStack_121c = local_1238;
  fVar20 = local_12b8 * 0.99999964;
  local_1258._4_4_ = fVar20;
  local_1258._0_4_ = fVar20;
  fStack_1250 = fVar20;
  fStack_124c = fVar20;
  fStack_1248 = fVar20;
  fStack_1244 = fVar20;
  fStack_1240 = fVar20;
  register0x0000131c = fVar20;
  local_1278 = local_12d8 * 0.99999964;
  fStack_1274 = local_1278;
  fStack_1270 = local_1278;
  fStack_126c = local_1278;
  fStack_1268 = local_1278;
  fStack_1264 = local_1278;
  fStack_1260 = local_1278;
  fStack_125c = local_1278;
  local_1298 = local_1298 * 1.0000004;
  fStack_1294 = local_1298;
  fStack_1290 = local_1298;
  fStack_128c = local_1298;
  fStack_1288 = local_1298;
  fStack_1284 = local_1298;
  fStack_1280 = local_1298;
  fStack_127c = local_1298;
  local_12b8 = local_12b8 * 1.0000004;
  fStack_12b4 = local_12b8;
  fStack_12b0 = local_12b8;
  fStack_12ac = local_12b8;
  fStack_12a8 = local_12b8;
  fStack_12a4 = local_12b8;
  fStack_12a0 = local_12b8;
  fStack_129c = local_12b8;
  local_12d8 = local_12d8 * 1.0000004;
  fStack_12d4 = local_12d8;
  fStack_12d0 = local_12d8;
  fStack_12cc = local_12d8;
  fStack_12c8 = local_12d8;
  fStack_12c4 = local_12d8;
  fStack_12c0 = local_12d8;
  fStack_12bc = local_12d8;
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar48 = uVar42 ^ 0x20;
  local_1540 = uVar43 ^ 0x20;
  local_12f8 = (tray->tnear).field_0.i[k];
  iStack_12f4 = local_12f8;
  iStack_12f0 = local_12f8;
  iStack_12ec = local_12f8;
  iStack_12e8 = local_12f8;
  iStack_12e4 = local_12f8;
  iStack_12e0 = local_12f8;
  iStack_12dc = local_12f8;
  local_1548 = uVar40 ^ 0x20;
  iVar1 = (tray->tfar).field_0.i[k];
  local_1318._4_4_ = iVar1;
  local_1318._0_4_ = iVar1;
  local_1318._8_4_ = iVar1;
  local_1318._12_4_ = iVar1;
  local_1318._16_4_ = iVar1;
  local_1318._20_4_ = iVar1;
  local_1318._24_4_ = iVar1;
  local_1318._28_4_ = iVar1;
  local_1568 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  pNVar41 = stack + 1;
  do {
    local_1550 = pNVar41;
    if (local_1550 == stack) break;
    pNVar41 = local_1550 + -1;
    sVar45 = local_1550[-1].ptr;
    do {
      if ((sVar45 & 8) == 0) {
        uVar37 = sVar45 & 0xfffffffffffffff0;
        uVar47 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar56._4_4_ = uVar47;
        auVar56._0_4_ = uVar47;
        auVar56._8_4_ = uVar47;
        auVar56._12_4_ = uVar47;
        auVar56._16_4_ = uVar47;
        auVar56._20_4_ = uVar47;
        auVar56._24_4_ = uVar47;
        auVar56._28_4_ = uVar47;
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar42),auVar56,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + uVar42));
        auVar21 = vsubps_avx(ZEXT1632(auVar51),auVar92);
        auVar22._4_4_ = auVar21._4_4_ * fStack_1234;
        auVar22._0_4_ = auVar21._0_4_ * local_1238;
        auVar22._8_4_ = auVar21._8_4_ * fStack_1230;
        auVar22._12_4_ = auVar21._12_4_ * fStack_122c;
        auVar22._16_4_ = auVar21._16_4_ * fStack_1228;
        auVar22._20_4_ = auVar21._20_4_ * fStack_1224;
        auVar22._24_4_ = auVar21._24_4_ * fStack_1220;
        auVar22._28_4_ = auVar21._28_4_;
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar43),auVar56,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + uVar43));
        auVar21._4_4_ = iStack_12f4;
        auVar21._0_4_ = local_12f8;
        auVar21._8_4_ = iStack_12f0;
        auVar21._12_4_ = iStack_12ec;
        auVar21._16_4_ = iStack_12e8;
        auVar21._20_4_ = iStack_12e4;
        auVar21._24_4_ = iStack_12e0;
        auVar21._28_4_ = iStack_12dc;
        auVar21 = vmaxps_avx(auVar21,auVar22);
        auVar36._4_4_ = uStack_11f4;
        auVar36._0_4_ = local_11f8;
        auVar36._8_4_ = uStack_11f0;
        auVar36._12_4_ = uStack_11ec;
        auVar36._16_4_ = uStack_11e8;
        auVar36._20_4_ = uStack_11e4;
        auVar36._24_4_ = uStack_11e0;
        auVar36._28_4_ = uStack_11dc;
        auVar22 = vsubps_avx(ZEXT1632(auVar51),auVar36);
        auVar23._4_4_ = auVar22._4_4_ * (float)local_1258._4_4_;
        auVar23._0_4_ = auVar22._0_4_ * (float)local_1258._0_4_;
        auVar23._8_4_ = auVar22._8_4_ * fStack_1250;
        auVar23._12_4_ = auVar22._12_4_ * fStack_124c;
        auVar23._16_4_ = auVar22._16_4_ * fStack_1248;
        auVar23._20_4_ = auVar22._20_4_ * fStack_1244;
        auVar23._24_4_ = auVar22._24_4_ * fStack_1240;
        auVar23._28_4_ = auVar22._28_4_;
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar40),auVar56,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + uVar40));
        auVar35._4_4_ = uStack_1214;
        auVar35._0_4_ = local_1218;
        auVar35._8_4_ = uStack_1210;
        auVar35._12_4_ = uStack_120c;
        auVar35._16_4_ = uStack_1208;
        auVar35._20_4_ = uStack_1204;
        auVar35._24_4_ = uStack_1200;
        auVar35._28_4_ = uStack_11fc;
        auVar22 = vsubps_avx(ZEXT1632(auVar51),auVar35);
        auVar25._4_4_ = auVar22._4_4_ * fStack_1274;
        auVar25._0_4_ = auVar22._0_4_ * local_1278;
        auVar25._8_4_ = auVar22._8_4_ * fStack_1270;
        auVar25._12_4_ = auVar22._12_4_ * fStack_126c;
        auVar25._16_4_ = auVar22._16_4_ * fStack_1268;
        auVar25._20_4_ = auVar22._20_4_ * fStack_1264;
        auVar25._24_4_ = auVar22._24_4_ * fStack_1260;
        auVar25._28_4_ = auVar22._28_4_;
        auVar22 = vmaxps_avx(auVar23,auVar25);
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar48),auVar56,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + uVar48));
        auVar21 = vmaxps_avx(auVar21,auVar22);
        auVar22 = vsubps_avx(ZEXT1632(auVar51),auVar92);
        auVar26._4_4_ = auVar22._4_4_ * fStack_1294;
        auVar26._0_4_ = auVar22._0_4_ * local_1298;
        auVar26._8_4_ = auVar22._8_4_ * fStack_1290;
        auVar26._12_4_ = auVar22._12_4_ * fStack_128c;
        auVar26._16_4_ = auVar22._16_4_ * fStack_1288;
        auVar26._20_4_ = auVar22._20_4_ * fStack_1284;
        auVar26._24_4_ = auVar22._24_4_ * fStack_1280;
        auVar26._28_4_ = auVar22._28_4_;
        auVar22 = vminps_avx(local_1318,auVar26);
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + local_1540),auVar56,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + local_1540));
        auVar23 = vsubps_avx(ZEXT1632(auVar51),auVar36);
        auVar27._4_4_ = auVar23._4_4_ * fStack_12b4;
        auVar27._0_4_ = auVar23._0_4_ * local_12b8;
        auVar27._8_4_ = auVar23._8_4_ * fStack_12b0;
        auVar27._12_4_ = auVar23._12_4_ * fStack_12ac;
        auVar27._16_4_ = auVar23._16_4_ * fStack_12a8;
        auVar27._20_4_ = auVar23._20_4_ * fStack_12a4;
        auVar27._24_4_ = auVar23._24_4_ * fStack_12a0;
        auVar27._28_4_ = auVar23._28_4_;
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + local_1548),auVar56,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + local_1548));
        auVar23 = vsubps_avx(ZEXT1632(auVar51),auVar35);
        auVar28._4_4_ = auVar23._4_4_ * fStack_12d4;
        auVar28._0_4_ = auVar23._0_4_ * local_12d8;
        auVar28._8_4_ = auVar23._8_4_ * fStack_12d0;
        auVar28._12_4_ = auVar23._12_4_ * fStack_12cc;
        auVar28._16_4_ = auVar23._16_4_ * fStack_12c8;
        auVar28._20_4_ = auVar23._20_4_ * fStack_12c4;
        auVar28._24_4_ = auVar23._24_4_ * fStack_12c0;
        auVar28._28_4_ = auVar23._28_4_;
        auVar23 = vminps_avx(auVar27,auVar28);
        auVar22 = vminps_avx(auVar22,auVar23);
        auVar21 = vcmpps_avx(auVar21,auVar22,2);
        if (((uint)sVar45 & 7) == 6) {
          auVar22 = vcmpps_avx(*(undefined1 (*) [32])(uVar37 + 0x1c0),auVar56,2);
          auVar23 = vcmpps_avx(auVar56,*(undefined1 (*) [32])(uVar37 + 0x1e0),1);
          auVar22 = vandps_avx(auVar22,auVar23);
          auVar21 = vandps_avx(auVar22,auVar21);
          auVar51 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
        }
        else {
          auVar51 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
        }
        auVar51 = vpsllw_avx(auVar51,0xf);
        auVar51 = vpacksswb_avx(auVar51,auVar51);
        unaff_RBX = (ulong)(byte)(SUB161(auVar51 >> 7,0) & 1 | (SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                                  (SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                                  (SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                                  (SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                                  (SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                                  (SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                                 SUB161(auVar51 >> 0x3f,0) << 7);
      }
      if ((sVar45 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar46 = 4;
        }
        else {
          uVar44 = sVar45 & 0xfffffffffffffff0;
          lVar38 = 0;
          for (uVar37 = unaff_RBX; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar38 = lVar38 + 1;
          }
          uVar46 = 0;
          for (uVar37 = unaff_RBX - 1 & unaff_RBX; sVar45 = *(size_t *)(uVar44 + lVar38 * 8),
              uVar37 != 0; uVar37 = uVar37 - 1 & uVar37) {
            pNVar41->ptr = sVar45;
            pNVar41 = pNVar41 + 1;
            lVar38 = 0;
            for (uVar24 = uVar37; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              lVar38 = lVar38 + 1;
            }
          }
        }
      }
      else {
        uVar46 = 6;
      }
    } while (uVar46 == 0);
    if (uVar46 == 6) {
      uVar46 = 0;
      local_1560 = (ulong)((uint)sVar45 & 0xf) - 8;
      bVar49 = local_1560 != 0;
      if (bVar49) {
        uVar44 = sVar45 & 0xfffffffffffffff0;
        local_1558 = 0;
        uVar37 = uVar48;
        do {
          lVar38 = local_1558 * 0x140;
          uVar47 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar71._4_4_ = uVar47;
          auVar71._0_4_ = uVar47;
          auVar71._8_4_ = uVar47;
          auVar71._12_4_ = uVar47;
          auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0x90 + lVar38),auVar71,
                                    *(undefined1 (*) [16])(uVar44 + lVar38));
          auVar83 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0xa0 + lVar38),auVar71,
                                    *(undefined1 (*) [16])(uVar44 + 0x10 + lVar38));
          auVar61 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0xb0 + lVar38),auVar71,
                                    *(undefined1 (*) [16])(uVar44 + 0x20 + lVar38));
          auVar62 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0xc0 + lVar38),auVar71,
                                    *(undefined1 (*) [16])(uVar44 + 0x30 + lVar38));
          auVar69 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0xd0 + lVar38),auVar71,
                                    *(undefined1 (*) [16])(uVar44 + 0x40 + lVar38));
          auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0xe0 + lVar38),auVar71,
                                    *(undefined1 (*) [16])(uVar44 + 0x50 + lVar38));
          auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0xf0 + lVar38),auVar71,
                                    *(undefined1 (*) [16])(uVar44 + 0x60 + lVar38));
          auVar81 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0x100 + lVar38),auVar71,
                                    *(undefined1 (*) [16])(uVar44 + 0x70 + lVar38));
          auVar91 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0x110 + lVar38),auVar71,
                                    *(undefined1 (*) [16])(uVar44 + 0x80 + lVar38));
          uVar47 = *(undefined4 *)(ray + k * 4);
          auVar72._4_4_ = uVar47;
          auVar72._0_4_ = uVar47;
          auVar72._8_4_ = uVar47;
          auVar72._12_4_ = uVar47;
          uVar47 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar98._4_4_ = uVar47;
          auVar98._0_4_ = uVar47;
          auVar98._8_4_ = uVar47;
          auVar98._12_4_ = uVar47;
          uVar47 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar103._4_4_ = uVar47;
          auVar103._0_4_ = uVar47;
          auVar103._8_4_ = uVar47;
          auVar103._12_4_ = uVar47;
          auVar71 = vsubps_avx(auVar51,auVar72);
          auVar87 = vsubps_avx(auVar83,auVar98);
          auVar51 = vsubps_avx(auVar61,auVar103);
          auVar83 = vsubps_avx(auVar62,auVar72);
          auVar61 = vsubps_avx(auVar69,auVar98);
          auVar62 = vsubps_avx(auVar70,auVar103);
          auVar69 = vsubps_avx(auVar58,auVar72);
          auVar70 = vsubps_avx(auVar81,auVar98);
          auVar58 = vsubps_avx(auVar91,auVar103);
          auVar81 = vsubps_avx(auVar69,auVar71);
          auVar91 = vsubps_avx(auVar70,auVar87);
          auVar72 = vsubps_avx(auVar58,auVar51);
          auVar52._0_4_ = auVar69._0_4_ + auVar71._0_4_;
          auVar52._4_4_ = auVar69._4_4_ + auVar71._4_4_;
          auVar52._8_4_ = auVar69._8_4_ + auVar71._8_4_;
          auVar52._12_4_ = auVar69._12_4_ + auVar71._12_4_;
          auVar67._0_4_ = auVar70._0_4_ + auVar87._0_4_;
          auVar67._4_4_ = auVar70._4_4_ + auVar87._4_4_;
          auVar67._8_4_ = auVar70._8_4_ + auVar87._8_4_;
          auVar67._12_4_ = auVar70._12_4_ + auVar87._12_4_;
          fVar8 = auVar51._0_4_;
          auVar73._0_4_ = auVar58._0_4_ + fVar8;
          fVar9 = auVar51._4_4_;
          auVar73._4_4_ = auVar58._4_4_ + fVar9;
          fVar10 = auVar51._8_4_;
          auVar73._8_4_ = auVar58._8_4_ + fVar10;
          fVar11 = auVar51._12_4_;
          auVar73._12_4_ = auVar58._12_4_ + fVar11;
          auVar99._0_4_ = auVar67._0_4_ * auVar72._0_4_;
          auVar99._4_4_ = auVar67._4_4_ * auVar72._4_4_;
          auVar99._8_4_ = auVar67._8_4_ * auVar72._8_4_;
          auVar99._12_4_ = auVar67._12_4_ * auVar72._12_4_;
          auVar98 = vfmsub231ps_fma(auVar99,auVar91,auVar73);
          auVar74._0_4_ = auVar73._0_4_ * auVar81._0_4_;
          auVar74._4_4_ = auVar73._4_4_ * auVar81._4_4_;
          auVar74._8_4_ = auVar73._8_4_ * auVar81._8_4_;
          auVar74._12_4_ = auVar73._12_4_ * auVar81._12_4_;
          auVar73 = vfmsub231ps_fma(auVar74,auVar72,auVar52);
          auVar53._0_4_ = auVar91._0_4_ * auVar52._0_4_;
          auVar53._4_4_ = auVar91._4_4_ * auVar52._4_4_;
          auVar53._8_4_ = auVar91._8_4_ * auVar52._8_4_;
          auVar53._12_4_ = auVar91._12_4_ * auVar52._12_4_;
          auVar52 = vfmsub231ps_fma(auVar53,auVar81,auVar67);
          fVar20 = *(float *)(ray + k * 4 + 0x60);
          auVar93._0_4_ = fVar20 * auVar52._0_4_;
          auVar93._4_4_ = fVar20 * auVar52._4_4_;
          auVar93._8_4_ = fVar20 * auVar52._8_4_;
          auVar93._12_4_ = fVar20 * auVar52._12_4_;
          uVar47 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar96._4_4_ = uVar47;
          auVar96._0_4_ = uVar47;
          auVar96._8_4_ = uVar47;
          auVar96._12_4_ = uVar47;
          auVar73 = vfmadd231ps_fma(auVar93,auVar96,auVar73);
          uVar47 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar104._4_4_ = uVar47;
          auVar104._0_4_ = uVar47;
          auVar104._8_4_ = uVar47;
          auVar104._12_4_ = uVar47;
          auVar67 = vfmadd231ps_fma(auVar73,auVar104,auVar98);
          auVar73 = vsubps_avx(auVar87,auVar61);
          auVar98 = vsubps_avx(auVar51,auVar62);
          auVar68._0_4_ = auVar87._0_4_ + auVar61._0_4_;
          auVar68._4_4_ = auVar87._4_4_ + auVar61._4_4_;
          auVar68._8_4_ = auVar87._8_4_ + auVar61._8_4_;
          auVar68._12_4_ = auVar87._12_4_ + auVar61._12_4_;
          auVar51._0_4_ = fVar8 + auVar62._0_4_;
          auVar51._4_4_ = fVar9 + auVar62._4_4_;
          auVar51._8_4_ = fVar10 + auVar62._8_4_;
          auVar51._12_4_ = fVar11 + auVar62._12_4_;
          fVar12 = auVar98._0_4_;
          auVar82._0_4_ = auVar68._0_4_ * fVar12;
          fVar14 = auVar98._4_4_;
          auVar82._4_4_ = auVar68._4_4_ * fVar14;
          fVar16 = auVar98._8_4_;
          auVar82._8_4_ = auVar68._8_4_ * fVar16;
          fVar18 = auVar98._12_4_;
          auVar82._12_4_ = auVar68._12_4_ * fVar18;
          auVar53 = vfmsub231ps_fma(auVar82,auVar73,auVar51);
          auVar52 = vsubps_avx(auVar71,auVar83);
          fVar13 = auVar52._0_4_;
          auVar88._0_4_ = auVar51._0_4_ * fVar13;
          fVar15 = auVar52._4_4_;
          auVar88._4_4_ = auVar51._4_4_ * fVar15;
          fVar17 = auVar52._8_4_;
          auVar88._8_4_ = auVar51._8_4_ * fVar17;
          fVar19 = auVar52._12_4_;
          auVar88._12_4_ = auVar51._12_4_ * fVar19;
          auVar75._0_4_ = auVar71._0_4_ + auVar83._0_4_;
          auVar75._4_4_ = auVar71._4_4_ + auVar83._4_4_;
          auVar75._8_4_ = auVar71._8_4_ + auVar83._8_4_;
          auVar75._12_4_ = auVar71._12_4_ + auVar83._12_4_;
          auVar51 = vfmsub231ps_fma(auVar88,auVar98,auVar75);
          fVar97 = auVar73._0_4_;
          auVar76._0_4_ = fVar97 * auVar75._0_4_;
          fVar100 = auVar73._4_4_;
          auVar76._4_4_ = fVar100 * auVar75._4_4_;
          fVar101 = auVar73._8_4_;
          auVar76._8_4_ = fVar101 * auVar75._8_4_;
          fVar102 = auVar73._12_4_;
          auVar76._12_4_ = fVar102 * auVar75._12_4_;
          auVar68 = vfmsub231ps_fma(auVar76,auVar52,auVar68);
          auVar77._0_4_ = fVar20 * auVar68._0_4_;
          auVar77._4_4_ = fVar20 * auVar68._4_4_;
          auVar77._8_4_ = fVar20 * auVar68._8_4_;
          auVar77._12_4_ = fVar20 * auVar68._12_4_;
          auVar51 = vfmadd231ps_fma(auVar77,auVar96,auVar51);
          auVar68 = vfmadd231ps_fma(auVar51,auVar104,auVar53);
          auVar53 = vsubps_avx(auVar83,auVar69);
          auVar60._0_4_ = auVar83._0_4_ + auVar69._0_4_;
          auVar60._4_4_ = auVar83._4_4_ + auVar69._4_4_;
          auVar60._8_4_ = auVar83._8_4_ + auVar69._8_4_;
          auVar60._12_4_ = auVar83._12_4_ + auVar69._12_4_;
          auVar69 = vsubps_avx(auVar61,auVar70);
          auVar57._0_4_ = auVar61._0_4_ + auVar70._0_4_;
          auVar57._4_4_ = auVar61._4_4_ + auVar70._4_4_;
          auVar57._8_4_ = auVar61._8_4_ + auVar70._8_4_;
          auVar57._12_4_ = auVar61._12_4_ + auVar70._12_4_;
          auVar70 = vsubps_avx(auVar62,auVar58);
          auVar78._0_4_ = auVar62._0_4_ + auVar58._0_4_;
          auVar78._4_4_ = auVar62._4_4_ + auVar58._4_4_;
          auVar78._8_4_ = auVar62._8_4_ + auVar58._8_4_;
          auVar78._12_4_ = auVar62._12_4_ + auVar58._12_4_;
          auVar83._0_4_ = auVar70._0_4_ * auVar57._0_4_;
          auVar83._4_4_ = auVar70._4_4_ * auVar57._4_4_;
          auVar83._8_4_ = auVar70._8_4_ * auVar57._8_4_;
          auVar83._12_4_ = auVar70._12_4_ * auVar57._12_4_;
          auVar83 = vfmsub231ps_fma(auVar83,auVar69,auVar78);
          auVar79._0_4_ = auVar78._0_4_ * auVar53._0_4_;
          auVar79._4_4_ = auVar78._4_4_ * auVar53._4_4_;
          auVar79._8_4_ = auVar78._8_4_ * auVar53._8_4_;
          auVar79._12_4_ = auVar78._12_4_ * auVar53._12_4_;
          auVar51 = vfmsub231ps_fma(auVar79,auVar70,auVar60);
          auVar61._0_4_ = auVar69._0_4_ * auVar60._0_4_;
          auVar61._4_4_ = auVar69._4_4_ * auVar60._4_4_;
          auVar61._8_4_ = auVar69._8_4_ * auVar60._8_4_;
          auVar61._12_4_ = auVar69._12_4_ * auVar60._12_4_;
          auVar61 = vfmsub231ps_fma(auVar61,auVar53,auVar57);
          auVar62._0_4_ = fVar20 * auVar61._0_4_;
          auVar62._4_4_ = fVar20 * auVar61._4_4_;
          auVar62._8_4_ = fVar20 * auVar61._8_4_;
          auVar62._12_4_ = fVar20 * auVar61._12_4_;
          auVar51 = vfmadd231ps_fma(auVar62,auVar96,auVar51);
          auVar62 = vfmadd231ps_fma(auVar51,auVar104,auVar83);
          auVar95._0_4_ = auVar62._0_4_ + auVar67._0_4_ + auVar68._0_4_;
          auVar95._4_4_ = auVar62._4_4_ + auVar67._4_4_ + auVar68._4_4_;
          auVar95._8_4_ = auVar62._8_4_ + auVar67._8_4_ + auVar68._8_4_;
          auVar95._12_4_ = auVar62._12_4_ + auVar67._12_4_ + auVar68._12_4_;
          auVar58._8_4_ = 0x7fffffff;
          auVar58._0_8_ = 0x7fffffff7fffffff;
          auVar58._12_4_ = 0x7fffffff;
          auVar51 = vminps_avx(auVar67,auVar68);
          auVar83 = vminps_avx(auVar51,auVar62);
          auVar51 = vandps_avx(auVar95,auVar58);
          auVar89._0_4_ = auVar51._0_4_ * 1.1920929e-07;
          auVar89._4_4_ = auVar51._4_4_ * 1.1920929e-07;
          auVar89._8_4_ = auVar51._8_4_ * 1.1920929e-07;
          auVar89._12_4_ = auVar51._12_4_ * 1.1920929e-07;
          uVar24 = CONCAT44(auVar89._4_4_,auVar89._0_4_);
          auVar84._0_8_ = uVar24 ^ 0x8000000080000000;
          auVar84._8_4_ = -auVar89._8_4_;
          auVar84._12_4_ = -auVar89._12_4_;
          auVar83 = vcmpps_avx(auVar83,auVar84,5);
          auVar61 = vmaxps_avx(auVar67,auVar68);
          auVar61 = vmaxps_avx(auVar61,auVar62);
          auVar61 = vcmpps_avx(auVar61,auVar89,2);
          auVar83 = vorps_avx(auVar83,auVar61);
          if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar83 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar83[0xf] < '\0') {
            auVar63._0_4_ = auVar72._0_4_ * fVar97;
            auVar63._4_4_ = auVar72._4_4_ * fVar100;
            auVar63._8_4_ = auVar72._8_4_ * fVar101;
            auVar63._12_4_ = auVar72._12_4_ * fVar102;
            auVar80._0_4_ = fVar13 * auVar91._0_4_;
            auVar80._4_4_ = fVar15 * auVar91._4_4_;
            auVar80._8_4_ = fVar17 * auVar91._8_4_;
            auVar80._12_4_ = fVar19 * auVar91._12_4_;
            auVar91 = vfmsub213ps_fma(auVar91,auVar98,auVar63);
            auVar85._0_4_ = auVar69._0_4_ * fVar12;
            auVar85._4_4_ = auVar69._4_4_ * fVar14;
            auVar85._8_4_ = auVar69._8_4_ * fVar16;
            auVar85._12_4_ = auVar69._12_4_ * fVar18;
            auVar90._0_4_ = fVar13 * auVar70._0_4_;
            auVar90._4_4_ = fVar15 * auVar70._4_4_;
            auVar90._8_4_ = fVar17 * auVar70._8_4_;
            auVar90._12_4_ = fVar19 * auVar70._12_4_;
            auVar70 = vfmsub213ps_fma(auVar70,auVar73,auVar85);
            auVar61 = vandps_avx(auVar63,auVar58);
            auVar62 = vandps_avx(auVar85,auVar58);
            auVar61 = vcmpps_avx(auVar61,auVar62,1);
            local_13d8 = vblendvps_avx(auVar70,auVar91,auVar61);
            auVar86._0_4_ = auVar53._0_4_ * fVar97;
            auVar86._4_4_ = auVar53._4_4_ * fVar100;
            auVar86._8_4_ = auVar53._8_4_ * fVar101;
            auVar86._12_4_ = auVar53._12_4_ * fVar102;
            auVar70 = vfmsub213ps_fma(auVar53,auVar98,auVar90);
            auVar64._0_4_ = auVar81._0_4_ * fVar12;
            auVar64._4_4_ = auVar81._4_4_ * fVar14;
            auVar64._8_4_ = auVar81._8_4_ * fVar16;
            auVar64._12_4_ = auVar81._12_4_ * fVar18;
            auVar91 = vfmsub213ps_fma(auVar72,auVar52,auVar64);
            auVar61 = vandps_avx(auVar64,auVar58);
            auVar62 = vandps_avx(auVar90,auVar58);
            auVar61 = vcmpps_avx(auVar61,auVar62,1);
            local_13c8 = vblendvps_avx(auVar70,auVar91,auVar61);
            auVar70 = vfmsub213ps_fma(auVar81,auVar73,auVar80);
            auVar69 = vfmsub213ps_fma(auVar69,auVar52,auVar86);
            auVar61 = vandps_avx(auVar80,auVar58);
            auVar62 = vandps_avx(auVar86,auVar58);
            auVar61 = vcmpps_avx(auVar61,auVar62,1);
            local_13b8 = vblendvps_avx(auVar69,auVar70,auVar61);
            auVar69._0_4_ = local_13b8._0_4_ * fVar20;
            auVar69._4_4_ = local_13b8._4_4_ * fVar20;
            auVar69._8_4_ = local_13b8._8_4_ * fVar20;
            auVar69._12_4_ = local_13b8._12_4_ * fVar20;
            auVar61 = vfmadd213ps_fma(auVar96,local_13c8,auVar69);
            auVar61 = vfmadd213ps_fma(auVar104,local_13d8,auVar61);
            auVar81._0_4_ = auVar61._0_4_ + auVar61._0_4_;
            auVar81._4_4_ = auVar61._4_4_ + auVar61._4_4_;
            auVar81._8_4_ = auVar61._8_4_ + auVar61._8_4_;
            auVar81._12_4_ = auVar61._12_4_ + auVar61._12_4_;
            auVar70._0_4_ = local_13b8._0_4_ * fVar8;
            auVar70._4_4_ = local_13b8._4_4_ * fVar9;
            auVar70._8_4_ = local_13b8._8_4_ * fVar10;
            auVar70._12_4_ = local_13b8._12_4_ * fVar11;
            auVar61 = vfmadd213ps_fma(auVar87,local_13c8,auVar70);
            auVar71 = vfmadd213ps_fma(auVar71,local_13d8,auVar61);
            auVar61 = vrcpps_avx(auVar81);
            auVar94._8_4_ = 0x3f800000;
            auVar94._0_8_ = &DAT_3f8000003f800000;
            auVar94._12_4_ = 0x3f800000;
            auVar87 = vfnmadd213ps_fma(auVar61,auVar81,auVar94);
            auVar61 = vfmadd132ps_fma(auVar87,auVar61,auVar61);
            local_13e8._0_4_ = (auVar71._0_4_ + auVar71._0_4_) * auVar61._0_4_;
            local_13e8._4_4_ = (auVar71._4_4_ + auVar71._4_4_) * auVar61._4_4_;
            local_13e8._8_4_ = (auVar71._8_4_ + auVar71._8_4_) * auVar61._8_4_;
            local_13e8._12_4_ = (auVar71._12_4_ + auVar71._12_4_) * auVar61._12_4_;
            uVar47 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar87._4_4_ = uVar47;
            auVar87._0_4_ = uVar47;
            auVar87._8_4_ = uVar47;
            auVar87._12_4_ = uVar47;
            auVar61 = vcmpps_avx(auVar87,local_13e8,2);
            uVar47 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar91._4_4_ = uVar47;
            auVar91._0_4_ = uVar47;
            auVar91._8_4_ = uVar47;
            auVar91._12_4_ = uVar47;
            auVar71 = vcmpps_avx(local_13e8,auVar91,2);
            auVar61 = vandps_avx(auVar61,auVar71);
            auVar71 = auVar83 & auVar61;
            if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar71[0xf] < '\0') {
              auVar83 = vandps_avx(auVar83,auVar61);
              auVar61 = vcmpps_avx(auVar81,_DAT_01feba10,4);
              auVar71 = auVar61 & auVar83;
              if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar71[0xf] < '\0') {
                auVar83 = vandps_avx(auVar83,auVar61);
                pSVar5 = context->scene;
                auVar61 = vrcpps_avx(auVar95);
                auVar65._8_4_ = 0x3f800000;
                auVar65._0_8_ = &DAT_3f8000003f800000;
                auVar65._12_4_ = 0x3f800000;
                auVar71 = vfnmadd213ps_fma(auVar95,auVar61,auVar65);
                auVar61 = vfmadd132ps_fma(auVar71,auVar61,auVar61);
                auVar59._8_4_ = 0x219392ef;
                auVar59._0_8_ = 0x219392ef219392ef;
                auVar59._12_4_ = 0x219392ef;
                auVar51 = vcmpps_avx(auVar51,auVar59,5);
                auVar51 = vandps_avx(auVar61,auVar51);
                auVar54._0_4_ = auVar67._0_4_ * auVar51._0_4_;
                auVar54._4_4_ = auVar67._4_4_ * auVar51._4_4_;
                auVar54._8_4_ = auVar67._8_4_ * auVar51._8_4_;
                auVar54._12_4_ = auVar67._12_4_ * auVar51._12_4_;
                local_1408 = vminps_avx(auVar54,auVar65);
                auVar55._0_4_ = auVar51._0_4_ * auVar68._0_4_;
                auVar55._4_4_ = auVar51._4_4_ * auVar68._4_4_;
                auVar55._8_4_ = auVar51._8_4_ * auVar68._8_4_;
                auVar55._12_4_ = auVar51._12_4_ * auVar68._12_4_;
                local_13f8 = vminps_avx(auVar55,auVar65);
                uVar47 = vmovmskps_avx(auVar83);
                uVar37 = CONCAT44((int)(uVar37 >> 0x20),uVar47);
                do {
                  uVar24 = 0;
                  for (uVar39 = uVar37; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000
                      ) {
                    uVar24 = uVar24 + 1;
                  }
                  uVar4 = *(uint *)(lVar38 + uVar44 + 0x120 + uVar24 * 4);
                  pGVar6 = (pSVar5->geometries).items[uVar4].ptr;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar37 = uVar37 ^ 1L << (uVar24 & 0x3f);
                    bVar50 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar50 = false;
                  }
                  else {
                    uVar39 = (ulong)(uint)((int)uVar24 * 4);
                    uVar47 = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar2 = *(undefined4 *)(local_1408 + uVar39);
                    local_1378._4_4_ = uVar2;
                    local_1378._0_4_ = uVar2;
                    local_1378._8_4_ = uVar2;
                    local_1378._12_4_ = uVar2;
                    uVar2 = *(undefined4 *)(local_13f8 + uVar39);
                    local_1368._4_4_ = uVar2;
                    local_1368._0_4_ = uVar2;
                    local_1368._8_4_ = uVar2;
                    local_1368._12_4_ = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_13e8 + uVar39);
                    args.context = context->user;
                    local_1348._4_4_ = uVar4;
                    local_1348._0_4_ = uVar4;
                    local_1348._8_4_ = uVar4;
                    local_1348._12_4_ = uVar4;
                    uVar2 = *(undefined4 *)(lVar38 + uVar44 + 0x130 + uVar39);
                    local_1358._4_4_ = uVar2;
                    local_1358._0_4_ = uVar2;
                    local_1358._8_4_ = uVar2;
                    local_1358._12_4_ = uVar2;
                    uVar2 = *(undefined4 *)(local_13d8 + uVar39);
                    uVar3 = *(undefined4 *)(local_13c8 + uVar39);
                    local_1398._4_4_ = uVar3;
                    local_1398._0_4_ = uVar3;
                    local_1398._8_4_ = uVar3;
                    local_1398._12_4_ = uVar3;
                    uVar3 = *(undefined4 *)(local_13b8 + uVar39);
                    local_1388._4_4_ = uVar3;
                    local_1388._0_4_ = uVar3;
                    local_1388._8_4_ = uVar3;
                    local_1388._12_4_ = uVar3;
                    local_13a8[0] = (RTCHitN)(char)uVar2;
                    local_13a8[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_13a8[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_13a8[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_13a8[4] = (RTCHitN)(char)uVar2;
                    local_13a8[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_13a8[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_13a8[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_13a8[8] = (RTCHitN)(char)uVar2;
                    local_13a8[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_13a8[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_13a8[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_13a8[0xc] = (RTCHitN)(char)uVar2;
                    local_13a8[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_13a8[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_13a8[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    vpcmpeqd_avx2(ZEXT1632(local_1348),ZEXT1632(local_1348));
                    uStack_1334 = (args.context)->instID[0];
                    local_1338 = uStack_1334;
                    uStack_1330 = uStack_1334;
                    uStack_132c = uStack_1334;
                    uStack_1328 = (args.context)->instPrimID[0];
                    uStack_1324 = uStack_1328;
                    uStack_1320 = uStack_1328;
                    uStack_131c = uStack_1328;
                    local_1578 = *local_1568;
                    uStack_1570 = local_1568[1];
                    args.valid = (int *)&local_1578;
                    args.geometryUserPtr = pGVar6->userPtr;
                    args.hit = local_13a8;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar6->occlusionFilterN)(&args);
                    }
                    auVar33._8_8_ = uStack_1570;
                    auVar33._0_8_ = local_1578;
                    if (auVar33 == (undefined1  [16])0x0) {
                      auVar51 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar51 = auVar51 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var7)(&args);
                      }
                      auVar34._8_8_ = uStack_1570;
                      auVar34._0_8_ = local_1578;
                      auVar83 = vpcmpeqd_avx((undefined1  [16])0x0,auVar34);
                      auVar51 = auVar83 ^ _DAT_01febe20;
                      auVar66._8_4_ = 0xff800000;
                      auVar66._0_8_ = 0xff800000ff800000;
                      auVar66._12_4_ = 0xff800000;
                      auVar83 = vblendvps_avx(auVar66,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar83);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar83;
                    }
                    auVar51 = vpslld_avx(auVar51,0x1f);
                    bVar31 = (auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar32 = (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar30 = (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar29 = -1 < auVar51[0xf];
                    bVar50 = ((bVar31 && bVar32) && bVar30) && bVar29;
                    if (((bVar31 && bVar32) && bVar30) && bVar29) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar47;
                      uVar37 = uVar37 ^ 1L << (uVar24 & 0x3f);
                    }
                  }
                  if (!bVar50) {
                    if (bVar49) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar46 = 1;
                    }
                    goto LAB_00654fa1;
                  }
                } while (uVar37 != 0);
                uVar37 = 0;
              }
            }
          }
          local_1558 = local_1558 + 1;
          bVar49 = local_1558 < local_1560;
        } while (local_1558 != local_1560);
      }
    }
LAB_00654fa1:
  } while ((uVar46 & 3) == 0);
  return local_1550 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }